

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

int hungarian_algorithm::
    solveBruteForce<int,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<int>>
              (matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
               *cost_function,unsigned_long num_rows,unsigned_long num_cols,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map,
              less<int> *cost_comparator,int *zero_cost)

{
  int iVar1;
  BruteForceSolver<int,_boost::numeric::ublas::matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>,_std::less<int>,_unsigned_long>
  solver;
  BruteForceSolver<int,_boost::numeric::ublas::matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>,_std::less<int>,_unsigned_long>
  local_a0;
  
  BruteForceSolver<int,_boost::numeric::ublas::matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>,_std::less<int>,_unsigned_long>
  ::BruteForceSolver(&local_a0,cost_function,num_rows,num_cols,cost_comparator,zero_cost);
  BruteForceSolver<int,_boost::numeric::ublas::matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>,_std::less<int>,_unsigned_long>
  ::solve(&local_a0);
  iVar1 = BruteForceSolver<int,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::less<int>,unsigned_long>
          ::getAssignment<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((BruteForceSolver<int,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::less<int>,unsigned_long>
                      *)&local_a0,assignment_map);
  BruteForceSolver<int,_boost::numeric::ublas::matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>,_std::less<int>,_unsigned_long>
  ::~BruteForceSolver(&local_a0);
  return iVar1;
}

Assistant:

Cost solveBruteForce(const CostFunction& cost_function, const Size num_rows, const Size num_cols,
                     AssignmentMap& assignment_map, const CostComparator& cost_comparator, const Cost& zero_cost)
{
  BruteForceSolver<Cost, CostFunction, CostComparator, Size> solver(
    cost_function, num_rows, num_cols, cost_comparator, zero_cost);
  solver.solve();
  return solver.getAssignment(assignment_map);
}